

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::GetCommissionerDataset
          (CommissionerImpl *this,Handler<CommissionerDataset> *aHandler,uint16_t aDatasetFlags)

{
  ErrorCode EVar1;
  undefined4 uVar2;
  Error *pEVar3;
  function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)> *this_00;
  char *begin;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  allocator local_1d9;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [8];
  char *local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  parse_func local_190 [1];
  ByteArray tlvTypes;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  string local_148;
  anon_class_32_1_d0c21527 onResponse;
  Error error;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&request,kConfirmable,kPost);
  GetCommissionerDatasetTlvs(&tlvTypes,aDatasetFlags);
  std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
  function(&onResponse.aHandler,aHandler);
  std::__cxx11::string::string((string *)local_1d8,"/c/cg",(allocator *)&local_148);
  coap::Message::SetUriPath((Error *)local_1b8,&request,(string *)local_1d8);
  pEVar3 = Error::operator=(&error,(Error *)local_1b8);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)local_1d8);
  if (EVar1 == kNone) {
    if (tlvTypes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        tlvTypes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1d8,kGet,&tlvTypes,kMeshCoP);
      AppendTlv((Error *)local_1b8,&request,(Tlv *)local_1d8);
      uVar2 = local_1b8._0_4_;
      std::__cxx11::string::~string((string *)&local_1b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1d8 + 8));
      if (uVar2 != none_type) goto LAB_0014d633;
    }
    local_158 = (code *)0x0;
    pcStack_150 = (code *)0x0;
    local_168._M_unused._M_object = (void *)0x0;
    local_168._8_8_ = 0;
    this_00 = (function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
               *)operator_new(0x20);
    std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
    function(this_00,&onResponse.aHandler);
    pcStack_150 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:379:23)>
                  ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:379:23)>
                ::_M_manager;
    local_168._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&request,(ResponseHandler *)&local_168,0xfc00,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_168);
    std::__cxx11::string::string((string *)local_1d8,"mgmt",&local_1d9);
    local_1b8._0_4_ = none_type;
    local_1b0 = "sent MGMT_COMMISSIONER_GET.req";
    local_1a8 = 0x1e;
    local_1a0._M_allocated_capacity = 0;
    local_190[0] = (parse_func)0x0;
    pcVar4 = "sent MGMT_COMMISSIONER_GET.req";
    local_1a0._8_8_ = (format_string_checker<char> *)local_1b8;
    while (begin = pcVar4, begin != "") {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_1b8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_148,(v10 *)"sent MGMT_COMMISSIONER_GET.req",(string_view)ZEXT816(0x1e),args);
    Log(kDebug,(string *)local_1d8,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)local_1d8);
  }
LAB_0014d633:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
    operator()(aHandler,(CommissionerDataset *)0x0,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tlvTypes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  coap::Message::~Message(&request);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::GetCommissionerDataset(Handler<CommissionerDataset> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     tlvTypes = GetCommissionerDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error               error;
        CommissionerDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeCommissionerDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtCommissionerGet));

    // If Get TLV is not present, get all Commissioner Dataset TLVs.
    if (!tlvTypes.empty())
    {
        SuccessOrExit(AppendTlv(request, {tlv::Type::kGet, tlvTypes}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_COMMISSIONER_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}